

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  state *this_00;
  uint *puVar1;
  vector<lzham::lzcompressor::lzdecision> *this_01;
  uint *lzdec;
  uint *puVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  uchar *puVar8;
  node_state *pnVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint8 *pComp;
  bit_cost_t bVar14;
  dict_match *pdVar15;
  uint8 *puVar16;
  lzdecision *plVar17;
  uint lit_pred0;
  uint is_match_model_index;
  uint uVar18;
  search_accelerator *this_02;
  lzdecision *plVar19;
  uint dict_pos;
  uint uVar20;
  uint min_new_capacity;
  long lVar21;
  uint uVar22;
  uint l;
  uint uVar23;
  uint uVar24;
  uint dict_pos_00;
  ulong uVar25;
  uint uVar26;
  undefined2 *puVar27;
  ulong uVar28;
  undefined2 uVar29;
  uint uVar30;
  uint match_hist_index;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  ulong local_ca8;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  *(undefined2 *)
   ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost + 4)
       = 0xffff;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 3) = 0;
  *(undefined4 *)
   &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  memset(&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_complexity
         ,0xff,0x2a000);
  min_new_capacity = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  if (min_new_capacity != 0) {
    this_00 = &(parse_state->super_raw_parse_thread_state).m_approx_state;
    uVar20 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
    this_02 = &this->m_accel;
    dict_pos_00 = uVar20 - ((this->m_accel).m_lookahead_pos & (this->m_accel).m_max_dict_size_mask);
    puVar1 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
             m_match_hist;
    uVar30 = 0;
    do {
      uVar26 = min_new_capacity - uVar30;
      uVar24 = 0x101;
      if (uVar26 < 0x101) {
        uVar24 = uVar26;
      }
      lzdec = &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
               [(ulong)uVar30 - 1].m_total_complexity;
      uVar13 = (this->m_accel).m_cur_dict_size;
      if (uVar30 != 0) {
        uVar7 = *(undefined8 *)(lzdec + 3);
        (this_00->super_state_base).m_cur_ofs = (int)uVar7;
        (this_00->super_state_base).m_cur_state = (int)((ulong)uVar7 >> 0x20);
        uVar7 = *(undefined8 *)(lzdec + 7);
        *(undefined8 *)puVar1 = *(undefined8 *)(lzdec + 5);
        *(undefined8 *)
         ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist +
         2) = uVar7;
        state_base::partial_advance(&this_00->super_state_base,(lzdecision *)lzdec);
      }
      lVar21 = *(long *)(lzdec + 10);
      iVar4 = lzdec[0xc];
      local_ca8 = 0;
      puVar8 = (this->m_accel).m_dict.m_p;
      lit_pred0 = 0;
      if (0 < (int)(uVar20 - (parse_state->super_raw_parse_thread_state).m_approx_state.
                             m_block_start_dict_ofs)) {
        lit_pred0 = (uint)puVar8[uVar20 - 1];
      }
      uVar5 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_ofs;
      uVar6 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
              m_cur_state;
      is_match_model_index = uVar6 << 6 | lit_pred0 >> 2;
      uVar22 = uVar24 + (uVar24 == 0);
      uVar23 = 1;
      lVar31 = 0;
      do {
        uVar29 = (undefined2)uVar30;
        if ((puVar1[lVar31] <= uVar13 + dict_pos_00) && (min_new_capacity != uVar30)) {
          uVar32 = 0;
          do {
            if ((this->m_accel).m_dict.m_p
                [uVar32 + ((dict_pos_00 - puVar1[lVar31]) + (this->m_accel).m_lookahead_pos &
                          (this->m_accel).m_max_dict_size_mask)] != puVar8[uVar32 + uVar20])
            goto LAB_0010eb3e;
            uVar32 = uVar32 + 1;
          } while (uVar22 != uVar32);
          uVar32 = (ulong)uVar22;
LAB_0010eb3e:
          uVar18 = (uint)uVar32;
          if (uVar23 <= uVar18) {
            match_hist_index = (uint)lVar31;
            state::get_rep_match_costs
                      (this_00,dict_pos_00,lzdec_bitcosts,match_hist_index,uVar23,uVar18,
                       is_match_model_index);
            uVar12 = iVar4 + 2 + match_hist_index;
            puVar27 = (undefined2 *)
                      ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
                              [(ulong)uVar30 + (ulong)uVar23].m_total_cost + 4);
            uVar25 = (ulong)uVar23;
            do {
              uVar28 = lzdec_bitcosts[uVar25] + lVar21;
              if ((uVar28 <= *(ulong *)(puVar27 + -6)) &&
                 ((uVar28 != *(ulong *)(puVar27 + -6) ||
                  (uVar12 < (uint)*(bit_cost_t *)(puVar27 + -2))))) {
                *(ulong *)(puVar27 + -6) = uVar28;
                *(uint *)(puVar27 + -2) = uVar12;
                *puVar27 = uVar29;
                *(uint *)(puVar27 + -0x14) = uVar5;
                *(uint *)(puVar27 + -0x12) = uVar6;
                uVar10 = puVar1[1];
                uVar7 = *(undefined8 *)
                         ((parse_state->super_raw_parse_thread_state).m_approx_state.
                          super_state_base.m_match_hist + 2);
                ((state_base *)(puVar27 + -0x10))->m_cur_ofs = puVar1[0];
                ((state_base *)(puVar27 + -0x10))->m_cur_state = uVar10;
                *(undefined8 *)(puVar27 + -0xc) = uVar7;
                *(uint *)(puVar27 + -0x1a) = uVar20;
                (((node_state *)(puVar27 + -0x16))->m_lzdec).m_pos = ~match_hist_index;
                *(int *)(puVar27 + -0x18) = (int)uVar25;
              }
              puVar27 = puVar27 + 0x1c;
              bVar33 = uVar25 < (uVar32 & 0xffffffff);
              uVar25 = uVar25 + 1;
            } while (bVar33);
            if (uVar18 < (uint)local_ca8) {
              uVar32 = local_ca8;
            }
            local_ca8 = uVar32 & 0xffffffff;
          }
        }
        lVar31 = lVar31 + 1;
        uVar23 = 2;
      } while (lVar31 != 4);
      uVar22 = (uint)local_ca8;
      if (uVar22 < (this->m_settings).m_fast_bytes) {
        if (1 < uVar26) {
          if ((uVar22 < 2) &&
             (uVar13 = search_accelerator::get_len2_match(this_02,dict_pos_00), uVar13 != 0)) {
            bVar14 = state::get_len2_match_cost
                               (this_00,&this->super_CLZBase,dict_pos,uVar13,is_match_model_index);
            uVar32 = bVar14 + lVar21;
            if ((uVar32 < *(ulong *)(lzdec + 0x26)) ||
               ((local_ca8 = 2, uVar32 == *(ulong *)(lzdec + 0x26) && (iVar4 + 7U < lzdec[0x28]))))
            {
              *(ulong *)(lzdec + 0x26) = uVar32;
              lzdec[0x28] = iVar4 + 7U;
              *(undefined2 *)(lzdec + 0x29) = uVar29;
              *(undefined8 *)(lzdec + 0x1f) = *(undefined8 *)&this_00->super_state_base;
              uVar7 = *(undefined8 *)
                       ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                        m_match_hist + 2);
              *(undefined8 *)(lzdec + 0x21) = *(undefined8 *)puVar1;
              *(undefined8 *)(lzdec + 0x23) = uVar7;
              lzdec[0x1c] = uVar20;
              lzdec[0x1d] = 2;
              lzdec[0x1e] = uVar13;
              local_ca8 = 2;
            }
          }
          uVar26 = (uint)local_ca8;
          pdVar15 = search_accelerator::find_matches(this_02,dict_pos_00,true);
          uVar22 = uVar26;
          if (pdVar15 != (dict_match *)0x0) {
            puVar16 = &pdVar15->m_len;
            uVar23 = 0;
            do {
              uVar22 = *puVar16 + 2;
              if (uVar24 <= *puVar16 + 2) {
                uVar22 = uVar24;
              }
              uVar18 = ((dict_match *)(puVar16 + -4))->m_dist;
              if ((uint)local_ca8 < uVar22) {
                match_lens[uVar23] = uVar22;
                match_distances[uVar23] = uVar18 & 0x7fffffff;
                uVar23 = uVar23 + 1;
                local_ca8 = (ulong)uVar22;
              }
              puVar16 = puVar16 + 5;
            } while (-1 < (int)uVar18);
            uVar22 = (uint)local_ca8;
            if (uVar23 != 0) {
              uVar26 = uVar26 + (uVar26 == 0);
              uVar13 = (this_00->super_state_base).m_cur_ofs;
              uVar5 = (this_00->super_state_base).m_cur_state;
              uVar32 = 0;
              do {
                uVar24 = uVar26 + 1;
                uVar26 = match_lens[uVar32];
                uVar6 = match_distances[uVar32];
                state::get_full_match_costs
                          (this_00,&this->super_CLZBase,uVar20,lzdec_bitcosts,uVar6,uVar24,uVar26,
                           is_match_model_index);
                for (; uVar24 <= uVar26; uVar24 = uVar24 + 1) {
                  uVar25 = (ulong)uVar24;
                  puVar2 = lzdec + uVar25 * 0xe;
                  uVar28 = lzdec_bitcosts[uVar25] + lVar21;
                  uVar18 = (uVar24 < 9) + 6 + iVar4;
                  if ((uVar28 <= *(ulong *)(lzdec + uVar25 * 0xe + 10)) &&
                     ((uVar28 != *(ulong *)(lzdec + uVar25 * 0xe + 10) || (uVar18 < puVar2[0xc]))))
                  {
                    *(ulong *)(puVar2 + 10) = uVar28;
                    puVar2[0xc] = uVar18;
                    *(undefined2 *)(puVar2 + 0xd) = uVar29;
                    (puVar2 + 3)[0] = uVar13;
                    (puVar2 + 3)[1] = uVar5;
                    uVar7 = *(undefined8 *)
                             ((parse_state->super_raw_parse_thread_state).m_approx_state.
                              super_state_base.m_match_hist + 2);
                    *(undefined8 *)(puVar2 + 5) = *(undefined8 *)puVar1;
                    *(undefined8 *)(puVar2 + 7) = uVar7;
                    *puVar2 = uVar20;
                    puVar2[1] = uVar24;
                    puVar2[2] = uVar6;
                  }
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar23);
            }
          }
        }
        if (uVar22 < (this->m_settings).m_fast_bytes) {
          bVar14 = state::get_lit_cost(this_00,this_02,uVar20,lit_pred0,is_match_model_index);
          uVar32 = bVar14 + lVar21;
          if ((uVar32 < *(ulong *)(lzdec + 0x18)) ||
             ((uVar22 = 1, uVar32 == *(ulong *)(lzdec + 0x18) && (iVar4 + 1U < lzdec[0x1a])))) {
            *(ulong *)(lzdec + 0x18) = uVar32;
            lzdec[0x1a] = iVar4 + 1U;
            *(undefined2 *)(lzdec + 0x1b) = uVar29;
            *(undefined8 *)(lzdec + 0x11) = *(undefined8 *)&this_00->super_state_base;
            uVar7 = *(undefined8 *)
                     ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                      m_match_hist + 2);
            *(undefined8 *)(lzdec + 0x13) = *(undefined8 *)puVar1;
            *(undefined8 *)(lzdec + 0x15) = uVar7;
            lzdec[0xe] = uVar20;
            *(undefined8 *)(lzdec + 0xf) = 0;
            uVar22 = 1;
          }
        }
      }
      uVar20 = uVar20 + uVar22;
      dict_pos_00 = dict_pos_00 + uVar22;
      uVar30 = uVar30 + uVar22;
    } while (uVar30 < min_new_capacity);
  }
  this_01 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  bVar33 = elemental_vector::increase_capacity
                     ((elemental_vector *)this_01,min_new_capacity,true,0xc,
                      vector<lzham::lzcompressor::lzdecision>::object_mover,true);
  if (bVar33) {
    plVar17 = this_01->m_p;
    plVar19 = plVar17;
    do {
      lVar21 = (long)(int)min_new_capacity;
      plVar19->m_dist =
           (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[lVar21].m_lzdec.
           m_pos;
      pnVar9 = (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states + lVar21 + -1;
      uVar7._0_4_ = pnVar9->m_total_complexity;
      uVar7._4_2_ = pnVar9->m_parent_index;
      uVar7._6_1_ = pnVar9->m_parent_state_index;
      uVar7._7_1_ = pnVar9->field_0x37;
      plVar19->m_pos = (undefined4)uVar7;
      plVar19->m_len = (int)((ulong)uVar7 >> 0x20);
      plVar19 = plVar19 + 1;
      sVar3 = *(short *)((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
                                [lVar21].m_total_cost + 4);
      min_new_capacity = (uint)sVar3;
      plVar17 = plVar17 + 1;
    } while (0 < sVar3);
    uVar30 = (int)((ulong)((long)plVar17 -
                          (long)(parse_state->super_raw_parse_thread_state).m_best_decisions.m_p) >>
                  2) * -0x55555555;
    uVar20 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
    if ((uVar20 != uVar30) &&
       (((uVar30 < uVar20 ||
         (uVar30 <= (parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity)) ||
        (bVar11 = elemental_vector::increase_capacity
                            ((elemental_vector *)this_01,uVar30,uVar20 + 1 == uVar30,0xc,
                             vector<lzham::lzcompressor::lzdecision>::object_mover,true), bVar11))))
    {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = uVar30;
    }
  }
  else {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  return bVar33;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#if 0
      for (uint i = 1; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }
#else
      memset( &pNodes[1], 0xFF, cMaxParseGraphNodes * sizeof(node_state));
#endif

      state &approx_state = parse_state.m_approx_state;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;
               }
            }

            match_hist_min_match_len = cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len); //match_hist_max_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }